

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_logger-inl.h
# Opt level: O1

void __thiscall spdlog::async_logger::backend_sink_it_(async_logger *this,log_msg *msg)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  pointer psVar4;
  
  psVar1 = (this->super_logger).sinks_.
           super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->super_logger).sinks_.
                super__Vector_base<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    bVar3 = sinks::sink::should_log
                      ((psVar4->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr,msg->level);
    if (bVar3) {
      peVar2 = (psVar4->super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*peVar2->_vptr_sink[2])(peVar2,msg);
    }
  }
  bVar3 = logger::should_flush_(&this->super_logger,msg);
  if (bVar3) {
    backend_flush_(this);
  }
  return;
}

Assistant:

SPDLOG_INLINE void spdlog::async_logger::backend_sink_it_(const details::log_msg &msg) {
    for (auto &sink : sinks_) {
        if (sink->should_log(msg.level)) {
            SPDLOG_TRY { sink->log(msg); }
            SPDLOG_LOGGER_CATCH(msg.source)
        }
    }